

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_token_write_quoted(fy_emitter *emit,fy_token *fyt,int flags,int indent,char qc)

{
  fy_emit_accum *ea;
  fy_emitter_cfg_flags fVar1;
  fy_emitter_write_type fVar2;
  bool bVar3;
  _Bool _Var4;
  fy_atom_style fVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  char *str;
  fy_atom *atom;
  fy_emitter_cfg_flags fVar11;
  undefined4 uVar12;
  fy_emitter_write_type wtype;
  byte bVar13;
  ulong uVar14;
  bool bVar15;
  int local_258;
  uint local_240;
  size_t non_utf8_len;
  undefined4 local_22c;
  int local_228;
  uint8_t non_utf8 [4];
  size_t len;
  fy_atom_iter iter;
  
  len = 0;
  bVar15 = (flags & 0x40U) == 0;
  fVar2 = fyewt_single_quoted_scalar_key;
  if (bVar15) {
    fVar2 = fyewt_single_quoted_scalar;
  }
  wtype = fyewt_double_quoted_scalar_key;
  if (bVar15) {
    wtype = fyewt_double_quoted_scalar;
  }
  if (qc == '\'') {
    wtype = fVar2;
  }
  fy_emit_write_indicator(emit,(uint)(qc != '\'') * 2 + di_single_quote_start,flags,indent,wtype);
  if (fyt != (fy_token *)0x0) {
    str = fy_token_get_direct_output(fyt,&len);
    if ((str == (char *)0x0) ||
       (fVar5 = fy_token_atom_style(fyt), fVar5 != (qc == '\"') + FYAS_SINGLE_QUOTED)) {
      atom = fy_token_atom(fyt);
      if (atom != (fy_atom *)0x0) {
        if ((flags & 8U) == 0) {
          fVar1 = emit->cfg->flags;
          fVar11 = fVar1 & 0xf00000;
          uVar12 = CONCAT31((int3)((uint)flags >> 8),
                            fVar11 != FYECF_MODE_FLOW_ONELINE &&
                            (fVar11 != FYECF_MODE_JSON_ONELINE &&
                            (fVar1 & 0xe00000) != FYECF_MODE_JSON));
        }
        else {
          uVar12 = 0;
        }
        local_228 = flags;
        fy_atom_iter_start(atom,&iter);
        ea = &emit->ea;
        fy_emit_accum_start(ea,wtype);
        bVar15 = false;
        local_22c = uVar12;
LAB_0012519e:
        bVar3 = false;
LAB_001251a5:
        do {
          non_utf8_len = 4;
          uVar6 = fy_atom_iter_utf8_quoted_get(&iter,&non_utf8_len,non_utf8);
          if ((int)uVar6 < 0) {
LAB_001256eb:
            fy_emit_accum_output(ea);
            (emit->ea).next = 0;
            (emit->ea).utf8_count = 0;
            (emit->ea).col = (emit->ea).start_col;
            fy_atom_iter_finish(&iter);
            flags = local_228;
            break;
          }
          if ((uVar6 != 0) || (non_utf8_len == 0)) {
            if (uVar6 != 0x20) {
              if (qc != '\'') goto LAB_0012530c;
              if (uVar6 != 9) {
                _Var4 = fy_is_lb(uVar6);
                if (!_Var4) goto LAB_0012530c;
                if ((char)local_22c == '\0') goto LAB_001256eb;
                if (!bVar3) {
                  fy_emit_accum_output(ea);
                  fy_emit_write_indent(emit,indent);
                }
                *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
                fy_emit_write_indent(emit,indent);
                bVar3 = true;
                goto LAB_001251a5;
              }
            }
            if ((bVar15 || (char)uVar12 != '\x01') ||
               (iVar9 = (emit->ea).col, iVar7 = fy_emit_width(emit), iVar9 <= iVar7)) {
LAB_00125408:
              fy_emit_accum_utf8_put(ea,uVar6);
            }
            else {
              if (qc == '\'') {
                iVar9 = fy_atom_iter_utf8_peek(&iter);
                if ((iVar9 != 9) && (iVar9 != 0x20)) goto LAB_00125408;
                fy_emit_accum_output(ea);
              }
              else {
                if (qc != '\"') goto LAB_00125408;
                fy_emit_accum_output(ea);
                iVar9 = fy_atom_iter_utf8_peek(&iter);
                if ((iVar9 == 0x20) || (iVar9 == 9)) {
                  fy_emit_putc(emit,wtype,0x5c);
                }
              }
              *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
              fy_emit_write_indent(emit,indent);
            }
            bVar15 = true;
            goto LAB_0012519e;
          }
          for (uVar14 = 0; uVar14 < non_utf8_len; uVar14 = uVar14 + 1) {
            bVar13 = non_utf8[uVar14];
            fy_emit_accum_utf8_put(ea,0x5c);
            fy_emit_accum_utf8_put(ea,0x78);
            iVar9 = (bVar13 >> 4) + 0x37;
            if (bVar13 < 0xa0) {
              iVar9 = (bVar13 >> 4) + 0x30;
            }
            fy_emit_accum_utf8_put(ea,iVar9);
            uVar6 = bVar13 & 0xf;
            iVar9 = uVar6 + 0x37;
            if (uVar6 < 10) {
              iVar9 = uVar6 + 0x30;
            }
            fy_emit_accum_utf8_put(ea,iVar9);
          }
        } while( true );
      }
    }
    else {
      fy_emit_write(emit,wtype,str,(int)len);
    }
  }
  fy_emit_write_indicator(emit,(qc != '\'') + 0xb + (uint)(qc != '\''),flags,indent,wtype);
  return;
LAB_0012530c:
  if (bVar3) {
    fy_emit_accum_output(ea);
    fy_emit_write_indent(emit,indent);
  }
  if (uVar6 == 0x27 && qc == '\'') {
    fy_emit_accum_utf8_put(ea,0x27);
    uVar8 = 0x27;
  }
  else {
    uVar8 = uVar6;
    if ((qc == '\"') &&
       ((((((uVar6 == 9 || (uVar6 == 0xa0)) || (_Var4 = fy_is_lb(uVar6), _Var4)) ||
          ((_Var4 = fy_is_print(uVar6), !_Var4 || (uVar6 == 0x22)))) || (uVar6 == 0x5c)) ||
        ((fVar1 = emit->cfg->flags,
         (fVar1 & 0xe00000) == FYECF_MODE_JSON || (fVar1 & 0xf00000) == FYECF_MODE_JSON_ONELINE &&
         (((0x10ffe0 < uVar6 - 0x20 || (uVar6 == 0x5c)) || (uVar6 == 0x22)))))))) {
      fy_emit_accum_utf8_put(ea,0x5c);
      uVar8 = 0x62;
      switch(uVar6) {
      case 8:
        break;
      case 9:
        uVar8 = 0x74;
        break;
      case 10:
        uVar8 = 0x6e;
        break;
      case 0xb:
switchD_001253b9_caseD_b:
        fVar1 = emit->cfg->flags;
        if ((fVar1 & 0xf00000) == FYECF_MODE_JSON_ONELINE || (fVar1 & 0xe00000) == FYECF_MODE_JSON)
        {
          if (uVar6 < 0x10000) {
            fy_emit_accum_utf8_put(ea,0x75);
            bVar13 = 0xc;
            for (iVar9 = 3; -1 < iVar9; iVar9 = iVar9 + -1) {
              uVar8 = uVar6 >> (bVar13 & 0x1f) & 0xf;
              iVar7 = uVar8 + 0x37;
              if (uVar8 < 10) {
                iVar7 = uVar8 + 0x30;
              }
              fy_emit_accum_utf8_put(ea,iVar7);
              bVar13 = bVar13 - 4;
            }
          }
          else {
            local_240 = (uVar6 >> 10 & 0x7ff) - 0x40 | 0xd800;
            fy_emit_accum_utf8_put(ea,0x75);
            bVar13 = 0xc;
            for (iVar9 = 3; -1 < iVar9; iVar9 = iVar9 + -1) {
              uVar8 = local_240 >> (bVar13 & 0x1f) & 0xf;
              iVar7 = uVar8 + 0x37;
              if (uVar8 < 10) {
                iVar7 = uVar8 + 0x30;
              }
              fy_emit_accum_utf8_put(ea,iVar7);
              bVar13 = bVar13 - 4;
            }
            fy_emit_accum_utf8_put(ea,0x5c);
            fy_emit_accum_utf8_put(ea,0x75);
            bVar13 = 0xc;
            for (iVar9 = 3; -1 < iVar9; iVar9 = iVar9 + -1) {
              uVar8 = (uVar6 & 0x3ff | 0xdc00) >> (bVar13 & 0x1f) & 0xf;
              iVar7 = uVar8 + 0x37;
              if (uVar8 < 10) {
                iVar7 = uVar8 + 0x30;
              }
              fy_emit_accum_utf8_put(ea,iVar7);
              bVar13 = bVar13 - 4;
            }
          }
          goto LAB_0012563f;
        }
        uVar8 = 0x30;
        if (uVar6 != 0) {
          if (uVar6 == 0x2029) {
            uVar8 = 0x50;
          }
          else if (uVar6 == 0xb) {
            uVar8 = 0x76;
          }
          else if (uVar6 == 0x1b) {
            uVar8 = 0x65;
          }
          else if (uVar6 == 0x85) {
            uVar8 = 0x4e;
          }
          else if (uVar6 == 0xa0) {
            uVar8 = 0x5f;
          }
          else if (uVar6 == 0x2028) {
            uVar8 = 0x4c;
          }
          else {
            if (uVar6 != 7) {
              uVar8 = (uint)(uVar6 < 0x10000) << 5 | 0x55;
              if (uVar6 < 0x100) {
                uVar8 = 0x78;
              }
              iVar9 = (uint)(uVar6 >= 0x10000) * 4 + 4;
              if (uVar6 < 0x100) {
                iVar9 = 2;
              }
              local_258 = iVar9 * 4;
              while( true ) {
                local_258 = local_258 + -4;
                fy_emit_accum_utf8_put(ea,uVar8);
                if (iVar9 < 1) break;
                iVar9 = iVar9 + -1;
                uVar10 = uVar6 >> ((byte)local_258 & 0x1f) & 0xf;
                uVar8 = uVar10 + 0x37;
                if (uVar10 < 10) {
                  uVar8 = uVar10 + 0x30;
                }
              }
              goto LAB_0012563f;
            }
            uVar8 = 0x61;
          }
        }
        break;
      case 0xc:
        uVar8 = 0x66;
        break;
      case 0xd:
        uVar8 = 0x72;
        break;
      default:
        uVar8 = uVar6;
        if ((uVar6 != 0x22) && (uVar6 != 0x5c)) goto switchD_001253b9_caseD_b;
      }
    }
  }
  fy_emit_accum_utf8_put(ea,uVar8);
LAB_0012563f:
  *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
  bVar15 = false;
  goto LAB_0012519e;
}

Assistant:

void fy_emit_token_write_quoted(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent, char qc) {
    bool allow_breaks, spaces, breaks;
    int c, i, w, digit;
    enum fy_emitter_write_type wtype;
    const char *str = NULL;
    size_t len = 0;
    bool should_indent, done_esc;
    struct fy_atom *atom;
    struct fy_atom_iter iter;
    enum fy_atom_style target_style;
    uint32_t hi_surrogate, lo_surrogate;
    uint8_t non_utf8[4];
    size_t non_utf8_len, k;

    wtype = qc == '\'' ?
            ((flags & DDNF_SIMPLE_SCALAR_KEY) ?
             fyewt_single_quoted_scalar_key : fyewt_single_quoted_scalar) :
            ((flags & DDNF_SIMPLE_SCALAR_KEY) ?
             fyewt_double_quoted_scalar_key : fyewt_double_quoted_scalar);

    fy_emit_write_indicator(emit,
                            qc == '\'' ? di_single_quote_start : di_double_quote_start,
                            flags, indent, wtype);

    /* XXX check whether this is ever the case */
    if (!fyt)
        goto out;

    /* note that if the original target style and the target differ
     * we can note use direct output
     */
    target_style = qc == '"' ? FYAS_DOUBLE_QUOTED : FYAS_SINGLE_QUOTED;

    /* simple case of direct output (large amount of cases) */
    str = fy_token_get_direct_output(fyt, &len);
    if (str && fy_token_atom_style(fyt) == target_style) {
        fy_emit_write(emit, wtype, str, len);
        goto out;
    }

    /* no atom? i.e. empty */
    atom = fy_token_atom(fyt);
    if (!atom)
        goto out;

    allow_breaks = !(flags & DDNF_SIMPLE) && !fy_emit_is_json_mode(emit) && !fy_emit_is_oneline(emit);

    spaces = false;
    breaks = false;

    fy_atom_iter_start(atom, &iter);
    fy_emit_accum_start(&emit->ea, wtype);
    for (;;) {
        non_utf8_len = sizeof(non_utf8);
        c = fy_atom_iter_utf8_quoted_get(&iter, &non_utf8_len, non_utf8);
        if (c < 0)
            break;

        if (c == 0 && non_utf8_len > 0) {
            for (k = 0; k < non_utf8_len; k++) {
                c = (int) non_utf8[k] & 0xff;
                fy_emit_accum_utf8_put(&emit->ea, '\\');
                fy_emit_accum_utf8_put(&emit->ea, 'x');
                digit = ((unsigned int) c >> 4) & 15;
                fy_emit_accum_utf8_put(&emit->ea,
                                       digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                digit = (unsigned int) c & 15;
                fy_emit_accum_utf8_put(&emit->ea,
                                       digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
            }
            continue;
        }

        if (fy_is_space(c) || (qc == '\'' && fy_is_ws(c))) {
            should_indent = allow_breaks && !spaces &&
                            fy_emit_accum_column(&emit->ea) > fy_emit_width(emit);

            if (should_indent &&
                ((qc == '\'' && fy_is_ws(fy_atom_iter_utf8_peek(&iter))) ||
                 qc == '"')) {
                fy_emit_accum_output(&emit->ea);

                if (qc == '"' && fy_is_ws(fy_atom_iter_utf8_peek(&iter)))
                    fy_emit_putc(emit, wtype, '\\');

                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);

            spaces = true;
            breaks = false;

        } else if (qc == '\'' && fy_is_lb(c)) {

            /* blergh */
            if (!allow_breaks)
                break;

            /* output run */
            if (!breaks) {
                fy_emit_accum_output(&emit->ea);
                fy_emit_write_indent(emit, indent);
            }

            emit->flags &= ~FYEF_INDENTATION;
            fy_emit_write_indent(emit, indent);

            breaks = true;
        } else {
            /* output run */
            if (breaks) {
                fy_emit_accum_output(&emit->ea);
                fy_emit_write_indent(emit, indent);
            }

            /* escape */
            if (qc == '\'' && c == '\'') {
                fy_emit_accum_utf8_put(&emit->ea, '\'');
                fy_emit_accum_utf8_put(&emit->ea, '\'');
            } else if (qc == '"' &&
                       ((!fy_is_printq(c) || c == '"' || c == '\\') ||
                        (fy_emit_is_json_mode(emit) && !fy_is_json_unescaped(c)))) {

                fy_emit_accum_utf8_put(&emit->ea, '\\');

                /* common YAML and JSON escapes */
                done_esc = false;
                switch (c) {
                    case '\b':
                        fy_emit_accum_utf8_put(&emit->ea, 'b');
                        done_esc = true;
                        break;
                    case '\f':
                        fy_emit_accum_utf8_put(&emit->ea, 'f');
                        done_esc = true;
                        break;
                    case '\n':
                        fy_emit_accum_utf8_put(&emit->ea, 'n');
                        done_esc = true;
                        break;
                    case '\r':
                        fy_emit_accum_utf8_put(&emit->ea, 'r');
                        done_esc = true;
                        break;
                    case '\t':
                        fy_emit_accum_utf8_put(&emit->ea, 't');
                        done_esc = true;
                        break;
                    case '"':
                        fy_emit_accum_utf8_put(&emit->ea, '"');
                        done_esc = true;
                        break;
                    case '\\':
                        fy_emit_accum_utf8_put(&emit->ea, '\\');
                        done_esc = true;
                        break;
                }

                if (done_esc)
                    goto done;

                if (!fy_emit_is_json_mode(emit)) {
                    switch (c) {
                        case '\0':
                            fy_emit_accum_utf8_put(&emit->ea, '0');
                            break;
                        case '\a':
                            fy_emit_accum_utf8_put(&emit->ea, 'a');
                            break;
                        case '\v':
                            fy_emit_accum_utf8_put(&emit->ea, 'v');
                            break;
                        case '\e':
                            fy_emit_accum_utf8_put(&emit->ea, 'e');
                            break;
                        case 0x85:
                            fy_emit_accum_utf8_put(&emit->ea, 'N');
                            break;
                        case 0xa0:
                            fy_emit_accum_utf8_put(&emit->ea, '_');
                            break;
                        case 0x2028:
                            fy_emit_accum_utf8_put(&emit->ea, 'L');
                            break;
                        case 0x2029:
                            fy_emit_accum_utf8_put(&emit->ea, 'P');
                            break;
                        default:
                            if ((unsigned int) c <= 0xff) {
                                fy_emit_accum_utf8_put(&emit->ea, 'x');
                                w = 2;
                            } else if ((unsigned int) c <= 0xffff) {
                                fy_emit_accum_utf8_put(&emit->ea, 'u');
                                w = 4;
                            } else if ((unsigned int) c <= 0xffffffff) {
                                fy_emit_accum_utf8_put(&emit->ea, 'U');
                                w = 8;
                            }

                            for (i = w - 1; i >= 0; i--) {
                                digit = ((unsigned int) c >> (i * 4)) & 15;
                                fy_emit_accum_utf8_put(&emit->ea,
                                                       digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                            }
                            break;
                    }

                } else {
                    /* JSON escapes all others in \uXXXX and \uXXXX\uXXXX */
                    w = 4;
                    if ((unsigned int) c <= 0xffff) {
                        fy_emit_accum_utf8_put(&emit->ea, 'u');
                        for (i = w - 1; i >= 0; i--) {
                            digit = ((unsigned int) c >> (i * 4)) & 15;
                            fy_emit_accum_utf8_put(&emit->ea,
                                                   digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                        }
                    } else {
                        hi_surrogate = 0xd800 | ((((c >> 16) & 0x1f) - 1) << 6) | ((c >> 10) & 0x3f);
                        lo_surrogate = 0xdc00 | (c & 0x3ff);

                        fy_emit_accum_utf8_put(&emit->ea, 'u');
                        for (i = w - 1; i >= 0; i--) {
                            digit = ((unsigned int) hi_surrogate >> (i * 4)) & 15;
                            fy_emit_accum_utf8_put(&emit->ea,
                                                   digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                        }

                        fy_emit_accum_utf8_put(&emit->ea, '\\');
                        fy_emit_accum_utf8_put(&emit->ea, 'u');
                        for (i = w - 1; i >= 0; i--) {
                            digit = ((unsigned int) lo_surrogate >> (i * 4)) & 15;
                            fy_emit_accum_utf8_put(&emit->ea,
                                                   digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                        }
                    }
                }
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);
            done:
            emit->flags &= ~FYEF_INDENTATION;
            spaces = false;
            breaks = false;
        }
    }
    fy_emit_accum_output(&emit->ea);
    fy_emit_accum_finish(&emit->ea);
    fy_atom_iter_finish(&iter);

    out:
    fy_emit_write_indicator(emit,
                            qc == '\'' ? di_single_quote_end : di_double_quote_end,
                            flags, indent, wtype);
}